

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O0

bool __thiscall ecjacobian::calcy(ecjacobian *this,bool ybit)

{
  bool bVar1;
  gfield *pgVar2;
  gfield *this_00;
  bigint<13> *y;
  ulong extraout_RAX;
  double __x;
  undefined1 local_5c [8];
  gfield tmp;
  gfield y2;
  bool ybit_local;
  ecjacobian *this_local;
  
  gfield::gfield((gfield *)(tmp.super_gfint.digits + 10));
  gfield::gfield((gfield *)local_5c);
  pgVar2 = gfield::square<13>((gfield *)(tmp.super_gfint.digits + 10),(bigint<13> *)this);
  pgVar2 = gfield::mul<13>(pgVar2,(bigint<13> *)this);
  this_00 = gfield::add<13,13>((gfield *)local_5c,(bigint<13> *)this,(bigint<13> *)this);
  y = &gfield::add<13>(this_00,(bigint<13> *)this)->super_gfint;
  pgVar2 = gfield::sub<13>(pgVar2,y);
  gfield::add<13>(pgVar2,&B.super_gfint);
  gfield::sqrt(&this->y,__x);
  if ((extraout_RAX & 1) == 0) {
    bigint<13>::zero(&(this->y).super_gfint);
    this_local._7_1_ = false;
  }
  else {
    bVar1 = bigint<13>::hasbit(&(this->y).super_gfint,0);
    if (bVar1 != ybit) {
      gfield::neg(&this->y);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool calcy(bool ybit)
    {
        gfield y2, tmp;
        y2.square(x).mul(x).sub(tmp.add(x, x).add(x)).add(B);
        if(!y.sqrt(y2)) { y.zero(); return false; }
        if(y.hasbit(0) != ybit) y.neg();
        return true;
    }